

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O0

TValue * cpluaopen(lua_State *L,lua_CFunction dummy,void *ud)

{
  global_State *g_00;
  uint64_t uVar1;
  GCtab *pGVar2;
  GCstr *pGVar3;
  global_State *g;
  void *ud_local;
  lua_CFunction dummy_local;
  lua_State *L_local;
  
  g_00 = (global_State *)(L->glref).ptr64;
  stack_init(L,L);
  pGVar2 = lj_tab_new(L,0,6);
  (L->env).gcptr64 = (uint64_t)pGVar2;
  uVar1 = (L->glref).ptr64;
  pGVar2 = lj_tab_new(L,0,2);
  *(ulong *)(uVar1 + 0x110) = (ulong)pGVar2 | 0xfffa000000000000;
  lj_str_init(L);
  lj_meta_init(L);
  lj_lex_init(L);
  pGVar3 = lj_err_str(L,LJ_ERR_ERRMEM);
  pGVar3->marked = pGVar3->marked | 0x20;
  (g_00->gc).threshold = (g_00->gc).total << 2;
  lj_trace_initstate(g_00);
  return (TValue *)0x0;
}

Assistant:

static TValue *cpluaopen(lua_State *L, lua_CFunction dummy, void *ud)
{
  global_State *g = G(L);
  UNUSED(dummy);
  UNUSED(ud);
  stack_init(L, L);
  /* NOBARRIER: State initialization, all objects are white. */
  setgcref(L->env, obj2gco(lj_tab_new(L, 0, LJ_MIN_GLOBAL)));
  settabV(L, registry(L), lj_tab_new(L, 0, LJ_MIN_REGISTRY));
  lj_str_init(L);
  lj_meta_init(L);
  lj_lex_init(L);
  fixstring(lj_err_str(L, LJ_ERR_ERRMEM));  /* Preallocate memory error msg. */
  g->gc.threshold = 4*g->gc.total;
  lj_trace_initstate(g);
  lj_err_verify();
  return NULL;
}